

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.h
# Opt level: O0

void __thiscall Basic_Simple_Test::~Basic_Simple_Test(Basic_Simple_Test *this)

{
  Basic_Simple_Test *this_local;
  
  ~Basic_Simple_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Basic, Simple)
{
    BigNumber num_1;
    BigNumber num_2("123");
    BigNumber num_3("-456");
    BigNumber num_4("-0789");
    EXPECT_EQ("0", num_1.toString());
    EXPECT_EQ("123", num_2.toString());
    EXPECT_EQ("-456", num_3.toString());
    EXPECT_EQ("-789", num_4.toString());
}